

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool mkvmuxer::anon_unknown_12::StrCpy(char *src,char **dst_ptr)

{
  size_t __n;
  void *pvVar1;
  long *in_RSI;
  char *in_RDI;
  size_t size;
  char **dst;
  bool local_1;
  
  if (in_RSI == (long *)0x0) {
    local_1 = false;
  }
  else {
    if ((void *)*in_RSI != (void *)0x0) {
      operator_delete__((void *)*in_RSI);
    }
    *in_RSI = 0;
    if (in_RDI == (char *)0x0) {
      local_1 = true;
    }
    else {
      __n = strlen(in_RDI);
      pvVar1 = operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
      *in_RSI = (long)pvVar1;
      if (*in_RSI == 0) {
        local_1 = false;
      }
      else {
        memcpy((void *)*in_RSI,in_RDI,__n);
        *(undefined1 *)(*in_RSI + __n) = 0;
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool StrCpy(const char* src, char** dst_ptr) {
  if (dst_ptr == NULL)
    return false;

  char*& dst = *dst_ptr;

  delete[] dst;
  dst = NULL;

  if (src == NULL)
    return true;

  const size_t size = strlen(src) + 1;

  dst = new (std::nothrow) char[size];  // NOLINT
  if (dst == NULL)
    return false;

  memcpy(dst, src, size - 1);
  dst[size - 1] = '\0';
  return true;
}